

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_groups.cxx
# Opt level: O2

void __thiscall xray_re::xr_group_object::save(xr_group_object *this,xr_writer *w)

{
  undefined4 local_1c;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0,&GROUPOBJ_VERSION);
  xr_writer::w_chunk<unsigned_int>(w,3,(uint *)&(this->super_xr_custom_object).field_0x6c);
  if (((this->super_xr_custom_object).field_0x6c & 1) == 0) {
    xr_scene::save_objects((this->super_xr_custom_object).m_scene,w,1,&this->m_objects);
  }
  else {
    xr_writer::open_chunk(w,5);
    local_1c = (undefined4)
               ((ulong)((long)(this->m_open_objects).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_open_objects).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    (*w->_vptr_xr_writer[2])(w,&local_1c,4);
    xr_writer::
    w_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_writer::f_w_sz>
              (w,&this->m_open_objects);
    xr_writer::close_chunk(w);
  }
  xr_writer::w_chunk(w,4,&this->m_reference);
  return;
}

Assistant:

void xr_group_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(GROUPOBJ_CHUNK_VERSION, GROUPOBJ_VERSION);
	w.w_chunk<uint32_t>(GROUPOBJ_CHUNK_FLAGS, m_flags);
	if (m_flags & GOF_OPEN) {
		w.open_chunk(GROUPOBJ_CHUNK_OPEN_OBJECT_LIST);
		w.w_size_u32(m_open_objects.size());
		w.w_seq(m_open_objects, xr_writer::f_w_sz());
		w.close_chunk();
	} else {
		scene().save_objects(w, GROUPOBJ_CHUNK_OBJECTS, m_objects);
	}
	w.w_chunk(GROUPOBJ_CHUNK_REFERENCE, m_reference);
}